

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::QuadrantRendederCase::initPrograms
          (QuadrantRendederCase *this,SourceCollections *programCollection)

{
  SourceCollections *pSVar1;
  ProgramSources *pPVar2;
  string local_2c8;
  ShaderSource local_2a8;
  allocator<char> local_279;
  string local_278;
  string local_258;
  ShaderSource local_238;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  ShaderSource local_1c8;
  allocator<char> local_199;
  string local_198;
  string local_178;
  ShaderSource local_158;
  allocator<char> local_129;
  string local_128;
  string local_108;
  ShaderSource local_e8;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  ShaderSource local_78;
  allocator<char> local_39;
  string local_38;
  SourceCollections *local_18;
  SourceCollections *programCollection_local;
  QuadrantRendederCase *this_local;
  
  local_18 = programCollection;
  programCollection_local = (SourceCollections *)this;
  if ((this->m_exitingStages & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vertex",&local_39);
    pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_38);
    BindingModel::(anonymous_namespace)::QuadrantRendederCase::genVertexSource_abi_cxx11_
              (&local_98,this);
    glu::VertexSource::VertexSource((VertexSource *)&local_78,&local_98);
    glu::ProgramSources::operator<<(pPVar2,&local_78);
    glu::VertexSource::~VertexSource((VertexSource *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  pSVar1 = local_18;
  if ((this->m_exitingStages & 2) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"tess_ctrl",&local_b9);
    pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&pSVar1->glslSources,&local_b8);
    BindingModel::(anonymous_namespace)::QuadrantRendederCase::genTessCtrlSource_abi_cxx11_
              (&local_108,this);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_e8,&local_108);
    glu::ProgramSources::operator<<(pPVar2,&local_e8);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  pSVar1 = local_18;
  if ((this->m_exitingStages & 4) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"tess_eval",&local_129);
    pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&pSVar1->glslSources,&local_128);
    BindingModel::(anonymous_namespace)::QuadrantRendederCase::genTessEvalSource_abi_cxx11_
              (&local_178,this);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_158,&local_178);
    glu::ProgramSources::operator<<(pPVar2,&local_158);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  pSVar1 = local_18;
  if ((this->m_exitingStages & 8) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"geometry",&local_199);
    pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&pSVar1->glslSources,&local_198);
    BindingModel::(anonymous_namespace)::QuadrantRendederCase::genGeometrySource_abi_cxx11_
              (&local_1e8,this);
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_1c8,&local_1e8);
    glu::ProgramSources::operator<<(pPVar2,&local_1c8);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
  }
  pSVar1 = local_18;
  if ((this->m_exitingStages & 0x10) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"fragment",&local_209);
    pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&pSVar1->glslSources,&local_208);
    BindingModel::(anonymous_namespace)::QuadrantRendederCase::genFragmentSource_abi_cxx11_
              (&local_258,this);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_238,&local_258);
    glu::ProgramSources::operator<<(pPVar2,&local_238);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
  }
  pSVar1 = local_18;
  if ((this->m_exitingStages & 0x20) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"compute",&local_279);
    pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&pSVar1->glslSources,&local_278);
    BindingModel::(anonymous_namespace)::QuadrantRendederCase::genComputeSource_abi_cxx11_
              (&local_2c8,this);
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_2a8,&local_2c8);
    glu::ProgramSources::operator<<(pPVar2,&local_2a8);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
  }
  return;
}

Assistant:

void QuadrantRendederCase::initPrograms (vk::SourceCollections& programCollection) const
{
	if ((m_exitingStages & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0u)
		programCollection.glslSources.add("vertex") << glu::VertexSource(genVertexSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0u)
		programCollection.glslSources.add("tess_ctrl") << glu::TessellationControlSource(genTessCtrlSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0u)
		programCollection.glslSources.add("tess_eval") << glu::TessellationEvaluationSource(genTessEvalSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0u)
		programCollection.glslSources.add("geometry") << glu::GeometrySource(genGeometrySource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0u)
		programCollection.glslSources.add("fragment") << glu::FragmentSource(genFragmentSource());

	if ((m_exitingStages & vk::VK_SHADER_STAGE_COMPUTE_BIT) != 0u)
		programCollection.glslSources.add("compute") << glu::ComputeSource(genComputeSource());
}